

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::drawHeader(QHexView *this,QTextCursor *c)

{
  QHexOptions *this_00;
  QHexDelegate *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  uint uVar5;
  ulong uVar6;
  QPalette *pQVar7;
  QColor *pQVar8;
  QTextCharFormat *cf_00;
  QTextCharFormat *cf_01;
  QTextCharFormat *extraout_RDX;
  QTextCharFormat *extraout_RDX_00;
  QTextCharFormat *cf_02;
  QTextCharFormat *cf_03;
  QTextCharFormat *cf_04;
  QTextCharFormat *extraout_RDX_01;
  QTextCharFormat *cf_05;
  QTextCharFormat *cf_06;
  QArrayDataPointer<char16_t> *this_01;
  ulong uVar9;
  bool bVar10;
  qreal qVar11;
  qreal qVar12;
  QTextBlockFormat bf;
  char16_t *pcStack_100;
  qsizetype local_f8;
  QString h;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QTextCharFormat cf;
  QArrayDataPointer<char16_t> local_78;
  double local_58;
  Data *local_50;
  QArrayDataPointer<char16_t> local_48;
  
  this_01 = (QArrayDataPointer<char16_t> *)&bf;
  if (((this->m_options).flags & 0x20) != 0) {
    return;
  }
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 == (QHexDelegate *)0x0) {
    bVar10 = false;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_a8,pQVar1,this);
    qVar4 = local_78.size;
    pcVar3 = local_78.ptr;
    pDVar2 = local_78.d;
    local_78.d = local_a8.d;
    local_78.ptr = local_a8.ptr;
    local_a8.d = pDVar2;
    local_a8.ptr = pcVar3;
    local_78.size = local_a8.size;
    local_a8.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    bVar10 = (Data *)local_78.size != (Data *)0x0;
  }
  if ((!bVar10) && ((this->m_options).addresslabel.d.size != 0)) {
    QString::operator=((QString *)&local_78,(QString *)&(this->m_options).addresslabel);
  }
  QTextCharFormat::QTextCharFormat(&cf);
  this_00 = &this->m_options;
  drawHeader::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_00);
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_78,1,&cf,this);
  }
  uVar5 = addressWidth(this);
  reduced((QString *)&bf,(QString *)&local_78,uVar5);
  operator+(&h," ",(QString *)&bf);
  operator+((QString *)&local_a8,&h," ");
  QTextCursor::insertText((QString *)c,(QTextCharFormat *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&h.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
  if (this->m_hexdelegate == (QHexDelegate *)0x0) {
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
LAB_001928c9:
    QString::operator=((QString *)&local_a8,(QString *)&(this->m_options).hexlabel);
  }
  else {
    drawHeader::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_01);
    pQVar1 = this->m_hexdelegate;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    if (pQVar1 == (QHexDelegate *)0x0) goto LAB_001928c9;
    (**(code **)(*(long *)pQVar1 + 0x68))(&h,pQVar1,this);
    qVar4 = local_a8.size;
    pcVar3 = local_a8.ptr;
    pDVar2 = local_a8.d;
    local_a8.d = h.d.d;
    local_a8.ptr = h.d.ptr;
    h.d.d = pDVar2;
    h.d.ptr = pcVar3;
    local_a8.size = h.d.size;
    h.d.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&h.d);
    if (local_a8.size == 0) goto LAB_001928c9;
  }
  if (local_a8.ptr == (char16_t *)0x0) {
    QString::QString(&h," ");
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&bf);
    QTextCursor::insertText((QString *)c,(QTextCharFormat *)&h);
    QTextFormat::~QTextFormat((QTextFormat *)&bf);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&h.d);
    cf_02 = extraout_RDX_00;
    for (uVar5 = 0; uVar5 < (this->m_options).linelength;
        uVar5 = uVar5 + (this->m_options).grouplength) {
      QString::number((uint)&local_c0,uVar5);
      QString::rightJustified
                ((longlong)&bf,(QChar)(char16_t)&local_c0,
                 (bool)((char)(this->m_options).grouplength * '\x02'));
      QString::toUpper_helper((QString *)&h.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      if (this->m_hexdelegate != (QHexDelegate *)0x0) {
        drawHeader::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_03);
        (**(code **)(*(long *)this->m_hexdelegate + 0x88))
                  (this->m_hexdelegate,&h.d,2,(QHexOptions *)&cf,this);
      }
      uVar9 = QHexCursor::column(this->m_hexcursor);
      if ((uVar9 == uVar5) && (((this->m_options).flags & 0x80) != 0)) {
        pQVar7 = (QPalette *)QWidget::palette();
        pQVar8 = QPalette::color(pQVar7,Highlight);
        QBrush::QBrush((QBrush *)&bf,pQVar8,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)&cf,(QBrush *)&bf);
        QBrush::~QBrush((QBrush *)&bf);
        pQVar7 = (QPalette *)QWidget::palette();
        pQVar8 = QPalette::color(pQVar7,HighlightedText);
        QBrush::QBrush((QBrush *)&bf,pQVar8,SolidPattern);
        QTextFormat::setForeground((QTextFormat *)&cf,(QBrush *)&bf);
        QBrush::~QBrush((QBrush *)&bf);
      }
      QTextCursor::insertText((QString *)c,(QTextCharFormat *)&h.d);
      QString::QString((QString *)&bf," ");
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_c0);
      QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
      QTextFormat::~QTextFormat((QTextFormat *)&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      drawHeader::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_04);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&h.d);
      cf_02 = extraout_RDX_01;
    }
  }
  else {
    pQVar1 = this->m_hexdelegate;
    if (pQVar1 != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_a8,2,&cf,this);
    }
    local_58 = hexColumnWidth(this);
    qVar11 = cellWidth(this);
    reduced((QString *)&local_c0,(QString *)&local_a8,(int)(local_58 / qVar11 + -1.0));
    operator+((QString *)&bf," ",(QString *)&local_c0);
    operator+(&h,(QString *)&bf," ");
    QTextCursor::insertText((QString *)c);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&h.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    cf_02 = extraout_RDX;
  }
  if (this->m_hexdelegate == (QHexDelegate *)0x0) {
    h.d.d = (Data *)0x0;
    h.d.ptr = (char16_t *)0x0;
    h.d.size = 0;
  }
  else {
    drawHeader::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_02);
    pQVar1 = this->m_hexdelegate;
    h.d.d = (Data *)0x0;
    h.d.ptr = (char16_t *)0x0;
    h.d.size = 0;
    if (pQVar1 != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x70))(&bf,pQVar1,this);
      pDVar2 = h.d.d;
      h.d.d = _bf;
      h.d.ptr = pcStack_100;
      _bf = pDVar2;
      h.d.size = local_f8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      if (h.d.size != 0) goto LAB_00192c0c;
    }
  }
  QString::operator=(&h,(QString *)&(this->m_options).asciilabel);
LAB_00192c0c:
  if (h.d.ptr == (char16_t *)0x0) {
    QString::QString((QString *)&bf," ");
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_c0);
    QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
    QTextFormat::~QTextFormat((QTextFormat *)&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
    for (uVar9 = 0; uVar9 < (this->m_options).linelength; uVar9 = uVar9 + 1) {
      QString::number((uint)&local_c0,(int)uVar9);
      QString::toUpper_helper((QString *)&bf);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      if (this->m_hexdelegate != (QHexDelegate *)0x0) {
        drawHeader::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_05);
        (**(code **)(*(long *)this->m_hexdelegate + 0x88))
                  (this->m_hexdelegate,&bf,3,(QHexOptions *)&cf,this);
      }
      uVar6 = QHexCursor::column(this->m_hexcursor);
      if ((uVar9 == uVar6) && (((this->m_options).flags & 0x80) != 0)) {
        pQVar7 = (QPalette *)QWidget::palette();
        pQVar8 = QPalette::color(pQVar7,Highlight);
        QBrush::QBrush((QBrush *)&local_c0,pQVar8,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)&cf,(QBrush *)&local_c0);
        QBrush::~QBrush((QBrush *)&local_c0);
        pQVar7 = (QPalette *)QWidget::palette();
        pQVar8 = QPalette::color(pQVar7,HighlightedText);
        QBrush::QBrush((QBrush *)&local_c0,pQVar8,SolidPattern);
        QTextFormat::setForeground((QTextFormat *)&cf,(QBrush *)&local_c0);
        QBrush::~QBrush((QBrush *)&local_c0);
      }
      QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
      drawHeader::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)this_00,(QHexOptions *)&cf,cf_06);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
    }
    QString::QString((QString *)&bf," ");
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_c0);
    QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
    QTextFormat::~QTextFormat((QTextFormat *)&local_c0);
  }
  else {
    pQVar1 = this->m_hexdelegate;
    if (pQVar1 != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&h,3,&cf,this);
    }
    qVar11 = endColumnX(this);
    local_58 = asciiColumnX(this);
    local_50 = (Data *)cellWidth(this);
    qVar12 = cellWidth(this);
    reduced((QString *)&local_48,&h,(int)(((qVar11 - local_58) - (double)local_50) / qVar12 + -1.0))
    ;
    operator+((QString *)&local_c0," ",(QString *)&local_48);
    operator+((QString *)&bf,(QString *)&local_c0," ");
    QTextCursor::insertText((QString *)c);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    this_01 = &local_48;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
  QTextBlockFormat::QTextBlockFormat(&bf);
  if (((this->m_options).flags & 8) != 0) {
    pQVar7 = (QPalette *)QWidget::palette();
    pQVar8 = QPalette::color(pQVar7,Window);
    QBrush::QBrush((QBrush *)&local_c0,pQVar8,SolidPattern);
    QTextFormat::setBackground((QTextFormat *)&bf,(QBrush *)&local_c0);
    QBrush::~QBrush((QBrush *)&local_c0);
  }
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&bf,this);
  }
  QTextCursor::setBlockFormat((QTextBlockFormat *)c);
  QTextCursor::insertBlock();
  QTextFormat::~QTextFormat((QTextFormat *)&bf);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&h.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QTextFormat::~QTextFormat((QTextFormat *)&cf);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  return;
}

Assistant:

void QHexView::drawHeader(QTextCursor& c) const {
    if(m_options.hasFlag(QHexFlags::NoHeader))
        return;

    static const auto RESET_FORMAT = [](const QHexOptions& options,
                                        QTextCharFormat& cf) {
        cf = {};
        cf.setForeground(options.headercolor);
    };

    QString addresslabel;
    if(m_hexdelegate)
        addresslabel = m_hexdelegate->addressHeader(this);
    if(addresslabel.isEmpty() && !m_options.addresslabel.isEmpty())
        addresslabel = m_options.addresslabel;

    QTextCharFormat cf;
    RESET_FORMAT(m_options, cf);
    if(m_hexdelegate)
        m_hexdelegate->renderHeaderPart(addresslabel, QHexArea::Address, cf,
                                        this);
    c.insertText(
        " " + QHexView::reduced(addresslabel, this->addressWidth()) + " ", cf);

    if(m_hexdelegate)
        RESET_FORMAT(m_options, cf);

    QString hexlabel;
    if(m_hexdelegate)
        hexlabel = m_hexdelegate->hexHeader(this);
    if(hexlabel.isEmpty())
        hexlabel = m_options.hexlabel;

    if(hexlabel.isNull()) {
        c.insertText(" ", {});

        for(auto i = 0u; i < m_options.linelength; i += m_options.grouplength) {
            QString h = QString::number(i, 16)
                            .rightJustified(m_options.grouplength * 2, '0')
                            .toUpper();

            if(m_hexdelegate) {
                RESET_FORMAT(m_options, cf);
                m_hexdelegate->renderHeaderPart(h, QHexArea::Hex, cf, this);
            }

            if(m_hexcursor->column() == static_cast<qint64>(i) &&
               m_options.hasFlag(QHexFlags::HighlightColumn)) {
                cf.setBackground(this->palette().color(QPalette::Highlight));
                cf.setForeground(
                    this->palette().color(QPalette::HighlightedText));
            }

            c.insertText(h, cf);
            c.insertText(" ", {});
            RESET_FORMAT(m_options, cf);
        }
    }
    else {
        if(m_hexdelegate)
            m_hexdelegate->renderHeaderPart(hexlabel, QHexArea::Hex, cf, this);
        c.insertText(
            " " +
            QHexView::reduced(
                hexlabel, (this->hexColumnWidth() / this->cellWidth()) - 1) +
            " ");
    }

    if(m_hexdelegate)
        RESET_FORMAT(m_options, cf);

    QString asciilabel;
    if(m_hexdelegate)
        asciilabel = m_hexdelegate->asciiHeader(this);
    if(asciilabel.isEmpty())
        asciilabel = m_options.asciilabel;

    if(asciilabel.isNull()) {
        c.insertText(" ", {});

        for(unsigned int i = 0; i < m_options.linelength; i++) {
            QString a = QString::number(i, 16).toUpper();

            if(m_hexdelegate) {
                RESET_FORMAT(m_options, cf);
                m_hexdelegate->renderHeaderPart(a, QHexArea::Ascii, cf, this);
            }

            if(m_hexcursor->column() == static_cast<qint64>(i) &&
               m_options.hasFlag(QHexFlags::HighlightColumn)) {
                cf.setBackground(this->palette().color(QPalette::Highlight));
                cf.setForeground(
                    this->palette().color(QPalette::HighlightedText));
            }

            c.insertText(a, cf);
            RESET_FORMAT(m_options, cf);
        }

        c.insertText(" ", {});
    }
    else {
        if(m_hexdelegate)
            m_hexdelegate->renderHeaderPart(asciilabel, QHexArea::Ascii, cf,
                                            this);
        c.insertText(" " +
                     QHexView::reduced(asciilabel, ((this->endColumnX() -
                                                     this->asciiColumnX() -
                                                     this->cellWidth()) /
                                                    this->cellWidth()) -
                                                       1) +
                     " ");
    }

    QTextBlockFormat bf;
    if(m_options.hasFlag(QHexFlags::StyledHeader))
        bf.setBackground(this->palette().color(QPalette::Window));
    if(m_hexdelegate)
        m_hexdelegate->renderHeader(bf, this);
    c.setBlockFormat(bf);
    c.insertBlock();
}